

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_unix.cpp
# Opt level: O2

void __thiscall QSystemLocaleData::QSystemLocaleData(QSystemLocaleData *this)

{
  QReadWriteLock::QReadWriteLock(&this->lock,NonRecursive);
  QLocale::QLocale(&this->lc_numeric,C,AnyScript,AnyCountry);
  QLocale::QLocale(&this->lc_time,C,AnyScript,AnyCountry);
  QLocale::QLocale(&this->lc_monetary,C,AnyScript,AnyCountry);
  QLocale::QLocale(&this->lc_messages,C,AnyScript,AnyCountry);
  (this->uiLanguages).d.ptr = (QString *)0x0;
  (this->uiLanguages).d.size = 0;
  (this->lc_collate_var).d.size = 0;
  (this->uiLanguages).d.d = (Data *)0x0;
  (this->lc_collate_var).d.d = (Data *)0x0;
  (this->lc_collate_var).d.ptr = (char *)0x0;
  (this->lc_measurement_var).d.ptr = (char *)0x0;
  (this->lc_measurement_var).d.size = 0;
  (this->lc_messages_var).d.size = 0;
  (this->lc_measurement_var).d.d = (Data *)0x0;
  (this->lc_messages_var).d.d = (Data *)0x0;
  (this->lc_messages_var).d.ptr = (char *)0x0;
  readEnvironment(this);
  return;
}

Assistant:

QSystemLocaleData()
        : lc_numeric(QLocale::C)
         ,lc_time(QLocale::C)
         ,lc_monetary(QLocale::C)
         ,lc_messages(QLocale::C)
    {
        readEnvironment();
    }